

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::HandleBeginArray
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  _Elt_pointer pPVar1;
  LogMessage *other;
  LogMessage local_68;
  ParseType local_2c;
  
  if (*(this->p_).ptr_ != '[') {
    protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/json_stream_parser.cc"
               ,0x2e6);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (\'[\') == (*p_.data()): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2c,other);
    protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  Advance(this);
  (*this->ow_->_vptr_ObjectWriter[4])(this->ow_,(this->key_).ptr_,(this->key_).length_);
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  local_2c = ARRAY_VALUE;
  pPVar1 = (this->stack_).c.
           super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pPVar1 == (this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_2c);
  }
  else {
    *pPVar1 = ARRAY_VALUE;
    (this->stack_).c.
    super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::HandleBeginArray() {
  GOOGLE_DCHECK_EQ('[', *p_.data());
  Advance();
  ow_->StartList(key_);
  key_ = StringPiece();
  stack_.push(ARRAY_VALUE);
  return util::Status();
}